

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O0

BigNumber * __thiscall
BigNumber::m_square_and_multiply
          (BigNumber *__return_storage_ptr__,BigNumber *this,BigNumber *e,BigNumber *N,int r,
          BigNumber *v,BigNumber *real_r2)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  reference pvVar1;
  char acStack_1f8 [32];
  undefined1 auStack_1d8 [4];
  uint local_1d4;
  allocator_type *local_1d0;
  BigNumber *local_1c8;
  BigNumber *local_1c0;
  BigNumber *local_1b8;
  char *local_1b0;
  allocator_type *local_1a8;
  BigNumber local_1a0;
  BigNumber local_180;
  BigNumber local_160;
  BigNumber local_140;
  uint local_11c;
  ulong uStack_118;
  uint j;
  unsigned_long i;
  undefined1 local_108 [7];
  bool empty;
  BigNumber m1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d0;
  undefined1 local_b8 [8];
  BigNumber unite;
  allocator<unsigned_int> local_85;
  uint local_84;
  iterator local_80;
  size_type local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  byte local_51;
  undefined8 local_50;
  unsigned_long __vla_expr0;
  uint local_3c;
  BigNumber *pBStack_38;
  uint size;
  BigNumber *v_local;
  BigNumber *pBStack_28;
  int r_local;
  BigNumber *N_local;
  BigNumber *e_local;
  BigNumber *this_local;
  BigNumber *result;
  
  __vla_expr0 = (unsigned_long)auStack_1d8;
  local_3c = 0x20;
  local_50 = 0x20;
  local_1b0 = acStack_1f8;
  local_51 = 0;
  local_84 = 1;
  local_80 = &local_84;
  local_78 = 1;
  local_1a8 = &local_85;
  local_1c8 = __return_storage_ptr__;
  local_1c0 = __return_storage_ptr__;
  local_1b8 = this;
  pBStack_38 = v;
  v_local._4_4_ = r;
  pBStack_28 = N;
  N_local = e;
  e_local = this;
  this_local = __return_storage_ptr__;
  std::allocator<unsigned_int>::allocator(local_1a8);
  __l_00._M_len = local_78;
  __l_00._M_array = local_80;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_70,__l_00,local_1a8);
  BigNumber(local_1c8,&local_70,local_1b8->m_base);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_70);
  std::allocator<unsigned_int>::~allocator(&local_85);
  m1.m_base._4_4_ = 1;
  local_1d0 = (allocator_type *)((long)&m1.m_base + 3);
  std::allocator<unsigned_int>::allocator(local_1d0);
  __l._M_len = 1;
  __l._M_array = (iterator)((long)&m1.m_base + 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_d0,__l,local_1d0);
  BigNumber((BigNumber *)local_b8,&local_d0,local_1b8->m_base);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_d0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&m1.m_base + 3));
  montgomery((BigNumber *)local_108,local_1b8,real_r2,pBStack_28,v_local._4_4_,pBStack_38);
  i._7_1_ = 1;
  local_1d4 = Polynome::m_degre(&N_local->super_Polynome);
  for (uStack_118 = (ulong)local_1d4; uStack_118 != 0; uStack_118 = uStack_118 - 1) {
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)N_local,
                        uStack_118 - 1);
    representation_binaire(*pvVar1,local_1b0,(double)local_3c);
    for (local_11c = 0; local_11c < local_3c; local_11c = local_11c + 1) {
      if ((i._7_1_ & 1) == 0) {
        montgomery(&local_140,local_1c8,local_1c8,pBStack_28,v_local._4_4_,pBStack_38);
        operator=(local_1c8,&local_140);
        ~BigNumber(&local_140);
      }
      if (local_1b0[local_11c] == '1') {
        if ((i._7_1_ & 1) == 0) {
          montgomery(&local_180,local_1c8,(BigNumber *)local_108,pBStack_28,v_local._4_4_,pBStack_38
                    );
          operator=(local_1c8,&local_180);
          ~BigNumber(&local_180);
        }
        else {
          BigNumber(&local_160,(BigNumber *)local_108);
          operator=(local_1c8,&local_160);
          ~BigNumber(&local_160);
          i._7_1_ = 0;
        }
      }
    }
  }
  montgomery(&local_1a0,local_1c8,(BigNumber *)local_b8,pBStack_28,v_local._4_4_,pBStack_38);
  operator=(local_1c8,&local_1a0);
  ~BigNumber(&local_1a0);
  local_51 = 1;
  ~BigNumber((BigNumber *)local_108);
  ~BigNumber((BigNumber *)local_b8);
  if ((local_51 & 1) == 0) {
    ~BigNumber(local_1c8);
  }
  return local_1c0;
}

Assistant:

BigNumber BigNumber::m_square_and_multiply(BigNumber &e, BigNumber &N, const int r, BigNumber &v, BigNumber &real_r2){

    unsigned int size = 32;
    char representation[(unsigned long)size];
    BigNumber result ({1}, m_base);
    BigNumber unite ({1}, m_base);
    BigNumber m1 = montgomery(*this, real_r2, N, r, v);
    bool empty = true;

    for(unsigned long i = e.m_degre() ; i > 0; i--){
        representation_binaire(e.m_coef[i - 1], representation, size);
        for(unsigned int j = 0; j < size; j++) {
            //cout << i << "  " << j << "   " << e.m_degre() << endl;
            if(!empty) {
                result = montgomery(result, result, N, r, v);
            }
            if (representation[j] == '1') {
                if(empty){
                    result = m1;
                    empty = false;
                }
                else {
                    result = montgomery(result, m1, N, r, v);
                }
            }
        }

    }
    result = montgomery(result, unite, N, r, v);
    return result;
}